

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O0

VirtualIterator<Kernel::TermList>
Lib::getUniquePersistentIterator<Lib::VirtualIterator<Kernel::TermList>>
          (VirtualIterator<Kernel::TermList> *it)

{
  bool bVar1;
  IteratorCore<Kernel::TermList> *in_RDI;
  IteratorCore<Kernel::TermList> *in_stack_ffffffffffffffb8;
  UniquePersistentIterator<Lib::VirtualIterator<Kernel::TermList>_> *in_stack_ffffffffffffffe0;
  
  bVar1 = VirtualIterator<Kernel::TermList>::hasNext((VirtualIterator<Kernel::TermList> *)0x78d0dd);
  if (bVar1) {
    ::operator_new(0x20);
    UniquePersistentIterator<Lib::VirtualIterator<Kernel::TermList>_>::UniquePersistentIterator
              (in_stack_ffffffffffffffe0,(VirtualIterator<Kernel::TermList> *)in_RDI);
    vi<Kernel::TermList>(in_stack_ffffffffffffffb8);
  }
  else {
    VirtualIterator<Kernel::TermList>::getEmpty();
  }
  return (VirtualIterator<Kernel::TermList>)in_RDI;
}

Assistant:

inline
VirtualIterator<ELEMENT_TYPE(Inner)> getUniquePersistentIterator(Inner it)
{
  if(!it.hasNext()) {
    return VirtualIterator<ELEMENT_TYPE(Inner)>::getEmpty();
  }
  return vi( new UniquePersistentIterator<Inner>(it) );
}